

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Fad<double> *pFVar4;
  double *pdVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  double *pdVar9;
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *pFVar10;
  double *pdVar11;
  Fad<double> *pFVar12;
  double dVar13;
  
  pFVar12 = (fadexpr->fadexpr_).left_;
  pFVar10 = (fadexpr->fadexpr_).right_;
  uVar6 = (pFVar12->dx_).num_elts;
  uVar1 = (((pFVar10->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar1 < (int)uVar6) {
    uVar1 = uVar6;
  }
  uVar2 = (this->dx_).num_elts;
  if (uVar1 == uVar2) {
    if (uVar1 == 0) goto LAB_013fd129;
    pdVar5 = (this->dx_).ptr_to_data;
  }
  else {
    if (uVar1 == 0) {
      if (uVar2 != 0) {
        pdVar5 = (this->dx_).ptr_to_data;
        if (pdVar5 != (double *)0x0) {
          operator_delete__(pdVar5);
          pFVar12 = (fadexpr->fadexpr_).left_;
          pFVar10 = (fadexpr->fadexpr_).right_;
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      goto LAB_013fd129;
    }
    if (uVar2 != 0) {
      pdVar5 = (this->dx_).ptr_to_data;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
        pFVar12 = (fadexpr->fadexpr_).left_;
        pFVar10 = (fadexpr->fadexpr_).right_;
      }
      (this->dx_).ptr_to_data = (double *)0x0;
    }
    (this->dx_).num_elts = uVar1;
    uVar7 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar7 = (ulong)uVar1 << 3;
    }
    pdVar5 = (double *)operator_new__(uVar7);
    (this->dx_).ptr_to_data = pdVar5;
    uVar6 = (pFVar12->dx_).num_elts;
  }
  if ((uVar6 == 0) || (pFVar4 = (pFVar10->fadexpr_).right_, (pFVar4->dx_).num_elts == 0)) {
    if (0 < (int)uVar1) {
      pFVar4 = (pFVar10->fadexpr_).right_;
      iVar3 = (pFVar4->dx_).num_elts;
      uVar7 = (ulong)uVar1;
      lVar8 = 0;
      do {
        pdVar9 = (double *)((long)(pFVar12->dx_).ptr_to_data + lVar8);
        if (uVar6 == 0) {
          pdVar9 = &pFVar12->defaultVal;
        }
        dVar13 = (pFVar10->fadexpr_).left_.constant_ - pFVar4->val_;
        pdVar11 = (double *)((long)(pFVar4->dx_).ptr_to_data + lVar8);
        if (iVar3 == 0) {
          pdVar11 = &pFVar4->defaultVal;
        }
        *(double *)((long)pdVar5 + lVar8) =
             (*pdVar9 * dVar13 + *pdVar11 * pFVar12->val_) / (dVar13 * dVar13);
        lVar8 = lVar8 + 8;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
  }
  else if (0 < (int)uVar1) {
    pdVar9 = (pFVar12->dx_).ptr_to_data;
    pdVar11 = (pFVar4->dx_).ptr_to_data;
    uVar7 = 0;
    do {
      dVar13 = (pFVar10->fadexpr_).left_.constant_ - pFVar4->val_;
      pdVar5[uVar7] = (pdVar9[uVar7] * dVar13 + pdVar11[uVar7] * pFVar12->val_) / (dVar13 * dVar13);
      uVar7 = uVar7 + 1;
    } while (uVar1 != uVar7);
  }
LAB_013fd129:
  this->val_ = pFVar12->val_ /
               ((pFVar10->fadexpr_).left_.constant_ - ((pFVar10->fadexpr_).right_)->val_);
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}